

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int beagleGetTransitionMatrix(int instance,int matrixIndex,double *outMatrix)

{
  int iVar1;
  BeagleImpl *pBVar2;
  
  pBVar2 = beagle::getBeagleInstance(instance);
  if (pBVar2 != (BeagleImpl *)0x0) {
    iVar1 = (**(code **)(*(long *)pBVar2 + 0xa0))
                      (pBVar2,matrixIndex,outMatrix,*(code **)(*(long *)pBVar2 + 0xa0));
    return iVar1;
  }
  return -4;
}

Assistant:

int beagleGetTransitionMatrix(int instance,
                              int matrixIndex,
                              double* outMatrix) {
    DEBUG_START_TIME();
    beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
    if (beagleInstance == NULL)
        return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
    int returnValue = beagleInstance->getTransitionMatrix(matrixIndex,outMatrix);
    DEBUG_END_TIME();
    return returnValue;
}